

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  int iVar2;
  cmCTest *pcVar3;
  size_type sVar4;
  pointer puVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  string *s;
  pointer puVar11;
  long lVar12;
  ulong uVar13;
  ulong local_10a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  cmDuration local_1078 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonValGrindOutput;
  ostringstream cmCTestLog_msg;
  ostringstream ostr;
  RegularExpression vgABR;
  RegularExpression vgIPW;
  RegularExpression vgUMR5;
  RegularExpression vgUMR4;
  RegularExpression vgUMR3;
  RegularExpression vgUMR2;
  RegularExpression vgUMR1;
  RegularExpression vgUMC;
  RegularExpression vgMPK2;
  RegularExpression vgMPK1;
  RegularExpression vgPAR;
  RegularExpression vgMLK2;
  RegularExpression vgMLK1;
  RegularExpression vgFMM;
  RegularExpression vgFIM;
  RegularExpression valgrindLine;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  lVar8 = std::__cxx11::string::find((char *)str,0x68f953);
  iVar2 = (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  cmsys::RegularExpression::RegularExpression(&valgrindLine,"^==[0-9][0-9]*==");
  cmsys::RegularExpression::RegularExpression
            (&vgFIM,"== .*Invalid free\\(\\) / delete / delete\\[\\]");
  cmsys::RegularExpression::RegularExpression
            (&vgFMM,"== .*Mismatched free\\(\\) / delete / delete \\[\\]");
  cmsys::RegularExpression::RegularExpression
            (&vgMLK1,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            (&vgMLK2,
             "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\) bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            (&vgPAR,"== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  cmsys::RegularExpression::RegularExpression
            (&vgMPK1,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            (&vgMPK2,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            (&vgUMC,"== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  cmsys::RegularExpression::RegularExpression
            (&vgUMR1,"== .*Use of uninitialised value of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression(&vgUMR2,"== .*Invalid read of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression(&vgUMR3,"== .*Jump to the invalid address ");
  cmsys::RegularExpression::RegularExpression
            (&vgUMR4,"== .*Syscall param .* contains uninitialised or unaddressable byte\\(s\\)");
  cmsys::RegularExpression::RegularExpression(&vgUMR5,"== .*Syscall param .* uninitialised");
  cmsys::RegularExpression::RegularExpression(&vgIPW,"== .*Invalid write of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression
            (&vgABR,"== .*pthread_mutex_unlock: mutex is locked by a different thread");
  nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Start test: ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::endl<char,std::char_traits<char>>(poVar10);
  pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  iVar7 = 0;
  cmCTest::Log(pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x3d3,(char *)local_1078[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_1078);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  local_10a0 = 0;
  uVar13 = 0;
  while( true ) {
    puVar5 = nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= local_10a0) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"test line ");
    poVar10 = std::operator<<(poVar10,(string *)
                                      (lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_10a0));
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x3d7,(char *)local_1078[0].__r,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    std::__cxx11::string::~string((string *)local_1078);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar6 = cmsys::RegularExpression::find
                      (&valgrindLine,
                       lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_10a0);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"valgrind  line ");
      poVar10 = std::operator<<(poVar10,(string *)
                                        (lines.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_10a0));
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x3dc,(char *)local_1078[0].__r,
                   (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      std::__cxx11::string::~string((string *)local_1078);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      s = lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + local_10a0;
      bVar6 = cmsys::RegularExpression::find(&vgFIM,s);
      lVar12 = 6;
      if (bVar6) {
LAB_004756a4:
        poVar10 = std::operator<<((ostream *)&ostr,"<b>");
        poVar10 = std::operator<<(poVar10,(string *)
                                          ((long)&(((this->ResultStrings).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p +
                                          (ulong)(uint)((int)lVar12 << 5)));
        std::operator<<(poVar10,"</b> ");
        piVar1 = (results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar12;
        *piVar1 = *piVar1 + 1;
        iVar7 = iVar7 + 1;
      }
      else {
        bVar6 = cmsys::RegularExpression::find(&vgFMM,s);
        lVar12 = 7;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgMLK1,s);
        lVar12 = 0xe;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgMLK2,s);
        lVar12 = 0xe;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgPAR,s);
        lVar12 = 0x12;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgMPK1,s);
        lVar12 = 0xf;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgMPK2,s);
        lVar12 = 0xf;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMC,s);
        lVar12 = 0x14;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMR1,s);
        lVar12 = 0x15;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMR2,s);
        lVar12 = 0x15;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMR3,s);
        lVar12 = 0x15;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMR4,s);
        lVar12 = 0x15;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgUMR5,s);
        lVar12 = 0x15;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgIPW,s);
        lVar12 = 0xc;
        if (bVar6) goto LAB_004756a4;
        bVar6 = cmsys::RegularExpression::find(&vgABR,s);
        if (bVar6) {
          lVar12 = 0;
          goto LAB_004756a4;
        }
      }
      sVar4 = lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_10a0]._M_string_length;
      poVar10 = std::operator<<((ostream *)&ostr,
                                (string *)
                                (lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_10a0));
      std::endl<char,std::char_traits<char>>(poVar10);
      uVar13 = uVar13 + sVar4;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&nonValGrindOutput,&local_10a0);
    }
    local_10a0 = local_10a0 + 1;
  }
  puVar11 = nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar11 == puVar5) goto LAB_004757e9;
    uVar13 = uVar13 + lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[*puVar11]._M_string_length;
    poVar10 = std::operator<<((ostream *)&ostr,
                              (string *)
                              (lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + *puVar11));
    std::endl<char,std::char_traits<char>>(poVar10);
    puVar11 = puVar11 + 1;
  } while (uVar13 <= (ulong)(long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize
           || (lVar8 != -1 || iVar2 == 0));
  std::operator<<((ostream *)&ostr,"....\n");
  std::operator<<((ostream *)&ostr,
                  "Test Output for this test has been truncated see testing machine logs for full output,\n"
                 );
  std::operator<<((ostream *)&ostr,"or put CTEST_FULL_OUTPUT in the output of this test program.\n")
  ;
LAB_004757e9:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"End test (elapsed: ");
  lVar8 = std::chrono::_V2::steady_clock::now();
  local_1078[0].__r = (double)(lVar8 - lVar9) / 1000000000.0;
  cmDurationTo<unsigned_int>(local_1078);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10,"s)");
  std::endl<char,std::char_traits<char>>(poVar10);
  pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x415,(char *)local_1078[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_1078);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)log,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  this->DefectCount = this->DefectCount + iVar7;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  cmsys::RegularExpression::~RegularExpression(&vgABR);
  cmsys::RegularExpression::~RegularExpression(&vgIPW);
  cmsys::RegularExpression::~RegularExpression(&vgUMR5);
  cmsys::RegularExpression::~RegularExpression(&vgUMR4);
  cmsys::RegularExpression::~RegularExpression(&vgUMR3);
  cmsys::RegularExpression::~RegularExpression(&vgUMR2);
  cmsys::RegularExpression::~RegularExpression(&vgUMR1);
  cmsys::RegularExpression::~RegularExpression(&vgUMC);
  cmsys::RegularExpression::~RegularExpression(&vgMPK2);
  cmsys::RegularExpression::~RegularExpression(&vgMPK1);
  cmsys::RegularExpression::~RegularExpression(&vgPAR);
  cmsys::RegularExpression::~RegularExpression(&vgMLK2);
  cmsys::RegularExpression::~RegularExpression(&vgMLK1);
  cmsys::RegularExpression::~RegularExpression(&vgFMM);
  cmsys::RegularExpression::~RegularExpression(&vgFIM);
  cmsys::RegularExpression::~RegularExpression(&valgrindLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return iVar7 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression valgrindLine("^==[0-9][0-9]*==");

  cmsys::RegularExpression vgFIM(
    R"(== .*Invalid free\(\) / delete / delete\[\])");
  cmsys::RegularExpression vgFMM(
    R"(== .*Mismatched free\(\) / delete / delete \[\])");
  cmsys::RegularExpression vgMLK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMLK2(
    "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\)"
    " bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgPAR(
    "== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgMPK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in"
    " loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMPK2(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgUMC(
    "== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  cmsys::RegularExpression vgUMR1(
    "== .*Use of uninitialised value of size [0-9,]+");
  cmsys::RegularExpression vgUMR2("== .*Invalid read of size [0-9,]+");
  cmsys::RegularExpression vgUMR3("== .*Jump to the invalid address ");
  cmsys::RegularExpression vgUMR4(
    "== .*Syscall param .* contains "
    "uninitialised or unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgUMR5("== .*Syscall param .* uninitialised");
  cmsys::RegularExpression vgIPW("== .*Invalid write of size [0-9,]+");
  cmsys::RegularExpression vgABR("== .*pthread_mutex_unlock: mutex is "
                                 "locked by a different thread");
  std::vector<std::string::size_type> nonValGrindOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (valgrindLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "valgrind  line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = cmCTestMemCheckHandler::NO_MEMORY_FAULT;
      auto& line = lines[cc];
      if (vgFIM.find(line)) {
        failure = cmCTestMemCheckHandler::FIM;
      } else if (vgFMM.find(line)) {
        failure = cmCTestMemCheckHandler::FMM;
      } else if (vgMLK1.find(line) || vgMLK2.find(line)) {
        failure = cmCTestMemCheckHandler::MLK;
      } else if (vgPAR.find(line)) {
        failure = cmCTestMemCheckHandler::PAR;
      } else if (vgMPK1.find(line) || vgMPK2.find(line)) {
        failure = cmCTestMemCheckHandler::MPK;
      } else if (vgUMC.find(line)) {
        failure = cmCTestMemCheckHandler::UMC;
      } else if (vgUMR1.find(line) || vgUMR2.find(line) || vgUMR3.find(line) ||
                 vgUMR4.find(line) || vgUMR5.find(line)) {
        failure = cmCTestMemCheckHandler::UMR;
      } else if (vgIPW.find(line)) {
        failure = cmCTestMemCheckHandler::IPW;
      } else if (vgABR.find(line)) {
        failure = cmCTestMemCheckHandler::ABR;
      }

      if (failure != cmCTestMemCheckHandler::NO_MEMORY_FAULT) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        results[failure]++;
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonValGrindOutput.push_back(cc);
    }
  }
  // Now put all all the non valgrind output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonValGrindOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}